

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_connection.hpp
# Opt level: O3

void __thiscall cinatra::coro_http_connection::build_ws_handshake_head(coro_http_connection *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  char *pcVar5;
  byte *pbVar6;
  char *pcVar7;
  uint8_t *puVar8;
  ulong uVar9;
  coro_http_response *this_00;
  uint8_t *p;
  byte *pbVar10;
  string_view key;
  string_view sVar11;
  uint8_t key_src [60];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  size_type __dnew;
  char accept_key [29];
  uint8_t sha1buf [20];
  sha1_context local_90;
  
  sVar11._M_str = "sec-websocket-key";
  sVar11._M_len = 0x11;
  sVar11 = coro_http_request::get_header_value(&this->request_,sVar11);
  puVar8 = (uint8_t *)sVar11._M_str;
  local_90.buf._0_8_ = *(undefined8 *)puVar8;
  local_90.buf._8_8_ = *(undefined8 *)(puVar8 + 8);
  local_90.buf._16_8_ = *(undefined8 *)(puVar8 + 0x10);
  local_90.blocks = 0;
  local_90.digest[0] = 0x67452301;
  local_90.digest[1] = 0xefcdab89;
  local_90.digest[2] = 0x98badcfe;
  local_90.digest[3] = 0x10325476;
  local_90.digest[4] = 0xc3d2e1f0;
  builtin_memcpy(local_90.buf + 0x18,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11",0x24);
  local_90.buflen = 0x3c;
  finish<void>(&local_90,sha1buf);
  uVar9 = 0x14;
  pcVar5 = accept_key;
  pbVar6 = sha1buf;
  do {
    pbVar10 = pbVar6;
    pcVar7 = pcVar5;
    bVar1 = *pbVar10;
    bVar2 = pbVar10[1];
    bVar3 = pbVar10[2];
    *pcVar7 = code_utils::MAP[bVar1 >> 2];
    pcVar7[1] = code_utils::MAP[((uint)bVar2 * 0x100 | (uint)bVar1 << 0x10) >> 0xc & 0x3f];
    pcVar7[2] = code_utils::MAP[(uint)bVar2 * 0x100 + (uint)bVar3 >> 6 & 0x3f];
    pcVar7[3] = code_utils::MAP[bVar3 & 0x3f];
    uVar9 = uVar9 - 3;
    pcVar5 = pcVar7 + 4;
    pbVar6 = pbVar10 + 3;
  } while (2 < uVar9);
  bVar1 = pbVar10[3];
  pcVar7[4] = code_utils::MAP[bVar1 >> 2];
  cVar4 = code_utils::MAP[(ulong)(pbVar10[4] & 0xf) * 4];
  pcVar7[5] = code_utils::MAP[((uint)bVar1 << 0x10 | (uint)pbVar10[4] << 8) >> 0xc & 0x3f];
  pcVar7[6] = cVar4;
  pcVar7[7] = '=';
  pcVar7[8] = '\0';
  this_00 = &this->response_;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"","");
  coro_http_response::set_status_and_content
            (this_00,switching_protocols,&local_f0,none,(string_view)(ZEXT816(0x1486bd) << 0x40));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  coro_http_response::add_header<char_const*,char_const*>(this_00,"Upgrade","WebSocket");
  coro_http_response::add_header<char_const*,char_const*>(this_00,"Connection","Upgrade");
  __dnew = 0x1c;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_110,&__dnew,0);
  local_110.field_2._M_allocated_capacity = __dnew;
  *(ulong *)(local_110._M_dataplus._M_p + 0xc) = CONCAT44(accept_key._16_4_,accept_key._12_4_);
  *(undefined8 *)(local_110._M_dataplus._M_p + 0x14) = accept_key._20_8_;
  *(undefined8 *)local_110._M_dataplus._M_p = accept_key._0_8_;
  *(ulong *)(local_110._M_dataplus._M_p + 8) = CONCAT44(accept_key._12_4_,accept_key._8_4_);
  local_110._M_string_length = __dnew;
  local_110._M_dataplus._M_p[__dnew] = '\0';
  coro_http_response::add_header<char_const*,std::__cxx11::string>
            (this_00,"Sec-WebSocket-Accept",&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  key._M_str = "sec-websocket-protocol";
  key._M_len = 0x16;
  sVar11 = coro_http_request::get_header_value(&this->request_,key);
  if (sVar11._M_len != 0) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,sVar11._M_str,sVar11._M_str + sVar11._M_len);
    coro_http_response::add_header<char_const*,std::__cxx11::string>
              (this_00,"Sec-WebSocket-Protocol",&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void build_ws_handshake_head() {
    uint8_t sha1buf[20], key_src[60];
    char accept_key[29];

    std::memcpy(key_src, request_.get_header_value("sec-websocket-key").data(),
                24);
    std::memcpy(key_src + 24, ws_guid, 36);
    sha1_context ctx;
    init(ctx);
    update(ctx, key_src, sizeof(key_src));
    finish(ctx, sha1buf);

    code_utils::base64_encode(accept_key, sha1buf, sizeof(sha1buf), 0);

    response_.set_status_and_content(status_type::switching_protocols, "");

    response_.add_header("Upgrade", "WebSocket");
    response_.add_header("Connection", "Upgrade");
    response_.add_header("Sec-WebSocket-Accept", std::string(accept_key, 28));
    auto protocal_str = request_.get_header_value("sec-websocket-protocol");
#ifdef CINATRA_ENABLE_GZIP
    if (is_client_ws_compressed_) {
      response_.add_header("Sec-WebSocket-Extensions",
                           "permessage-deflate; client_no_context_takeover");
    }
#endif
    if (!protocal_str.empty()) {
      response_.add_header("Sec-WebSocket-Protocol", std::string(protocal_str));
    }
  }